

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

bool __thiscall gnilk::LogManager::RemoveSink(LogManager *this,string *name)

{
  mutex *__mutex;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __position;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __it;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __it_00;
  string *local_38;
  
  __mutex = &this->sinkLock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar4);
  }
  __it._M_current =
       (this->sinks).
       super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar1 - (long)__it._M_current >> 5;
  __it_00._M_current = __it._M_current;
  local_38 = name;
  if (0 < lVar5) {
    __it_00._M_current =
         (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
         ((long)&((__it._M_current)->_M_t).
                 super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                 .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl +
         ((long)puVar1 - (long)__it._M_current & 0xffffffffffffffe0U));
    lVar5 = lVar5 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)&local_38,__it);
      __position._M_current = __it._M_current;
      if (bVar2) goto LAB_0014738c;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)&local_38,__it._M_current + 1);
      __position._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0014738c;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)&local_38,__it._M_current + 2);
      __position._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0014738c;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)&local_38,__it._M_current + 3);
      __position._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0014738c;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)puVar1 - (long)__it_00._M_current >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __position._M_current = puVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                              *)&local_38,__it_00), __position._M_current = __it_00._M_current,
         bVar2)) goto LAB_0014738c;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_38,__it_00);
    __position._M_current = __it_00._M_current;
    if (bVar2) goto LAB_0014738c;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                    ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0> *)
                     &local_38,__it_00);
  __position._M_current = __it_00._M_current;
  if (!bVar2) {
    __position._M_current = puVar1;
  }
LAB_0014738c:
  if (__position._M_current != puVar1) {
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::_M_erase(&this->sinks,(iterator)__position._M_current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __position._M_current != puVar1;
}

Assistant:

bool LogManager::RemoveSink(const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);

    auto itSink = std::find_if(sinks.begin(), sinks.end(), [&name](const LogSinkInstance::Ref &other)->bool {
        return (other->GetName() == name);
    });

    if (itSink == sinks.end()) {
        return false;
    }
    sinks.erase(itSink);
    return true;
}